

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O3

void __thiscall despot::Bridge::PrintAction(Bridge *this,ACT_TYPE action,ostream *out)

{
  long lVar1;
  char *pcVar2;
  
  if (LEFT == action) {
    pcVar2 = "Move left";
    lVar1 = 9;
  }
  else if (RIGHT == action) {
    pcVar2 = "Move right";
    lVar1 = 10;
  }
  else {
    pcVar2 = "Call for help";
    lVar1 = 0xd;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void Bridge::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == LEFT) {
		cout << "Move left" << endl;
	} else if (action == RIGHT) {
		cout << "Move right" << endl;
	} else {
		cout << "Call for help" << endl;
	}
}